

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_propagation.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_70cf1::ir_constant_propagation_visitor::handle_rvalue
          (ir_constant_propagation_visitor *this,ir_rvalue **rvalue)

{
  ir_rvalue **rvalue_local;
  ir_constant_propagation_visitor *this_local;
  
  constant_propagation(this,rvalue);
  constant_folding(this,rvalue);
  return;
}

Assistant:

void
ir_constant_propagation_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   constant_propagation(rvalue);
   constant_folding(rvalue);
}